

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetactivation.cpp
# Opt level: O0

float __thiscall ncnn::activate_op_stair<float>::operator()(activate_op_stair<float> *this,float *x)

{
  float fVar1;
  float *in_RSI;
  double dVar2;
  double dVar3;
  int n;
  undefined4 local_4;
  
  dVar2 = std::floor((double)(ulong)(uint)*in_RSI);
  if ((int)SUB84(dVar2,0) % 2 == 0) {
    dVar3 = floor((double)*in_RSI / 2.0);
  }
  else {
    fVar1 = *in_RSI;
    dVar3 = floor((double)*in_RSI / 2.0);
    dVar3 = (double)(fVar1 - (float)(int)SUB84(dVar2,0)) + dVar3;
  }
  local_4 = (float)dVar3;
  return local_4;
}

Assistant:

T operator()(const T &x) const
  {
    int n = floor(x);
    if (n % 2 == 0)
      return floor(x / 2.);
    else
      return (x - n) + floor(x / 2.);
  }